

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

void receive_wkr(VIface *iface)

{
  initializer_list<viface::VIface_*> __l;
  MyDispatcher printer;
  dispatcher_cb mycb;
  _Bind<bool_(MyDispatcher::*(MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_80;
  set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_> ifaces;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_38;
  
  __l._M_len = 1;
  __l._M_array = (iterator)&mycb;
  mycb.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)iface;
  std::set<viface::VIface_*,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>::set
            (&ifaces,__l,(less<viface::VIface_*> *)&local_80,(allocator_type *)&printer);
  printer.count = 0;
  local_80._M_f = (offset_in_MyDispatcher_to_subr)MyDispatcher::handler;
  local_80._8_8_ = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_MyDispatcher_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_MyDispatcher_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )&printer;
  std::
  function<bool(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&)>
  ::
  function<std::_Bind<bool(MyDispatcher::*(MyDispatcher*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&)>,void>
            ((function<bool(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_char,std::allocator<unsigned_char>>&)>
              *)&mycb,&local_80);
  while (quit == 0) {
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
    ::function(&local_38,&mycb);
    viface::dispatch(&ifaces,&local_38,1000);
    std::_Function_base::~_Function_base(&local_38.super__Function_base);
  }
  std::_Function_base::~_Function_base(&mycb.super__Function_base);
  std::
  _Rb_tree<viface::VIface_*,_viface::VIface_*,_std::_Identity<viface::VIface_*>,_std::less<viface::VIface_*>,_std::allocator<viface::VIface_*>_>
  ::~_Rb_tree(&ifaces._M_t);
  return;
}

Assistant:

void receive_wkr(viface::VIface* iface)
{
    set<viface::VIface*> ifaces = {iface};
    MyDispatcher printer;
    viface::dispatcher_cb mycb = bind(
        &MyDispatcher::handler,
        &printer,
        placeholders::_1,
        placeholders::_2,
        placeholders::_3
        );

    while (!quit) {
        // We configure a dispatcher with a timeout of 1 second
        viface::dispatch(ifaces, mycb, 1000);
    }
}